

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::schema::Node::SourceInfo::Reader> * __thiscall
capnp::compiler::Compiler::getSourceInfo
          (Maybe<capnp::schema::Node::SourceInfo::Reader> *__return_storage_ptr__,Compiler *this,
          uint64_t id)

{
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  Maybe<kj::_::Mutex::Waiter_&> *local_20;
  uint64_t id_local;
  Compiler *this_local;
  
  local_20 = (Maybe<kj::_::Mutex::Waiter_&> *)id;
  id_local = (uint64_t)this;
  this_local = (Compiler *)__return_storage_ptr__;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffd0,&this->impl);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                       &stack0xffffffffffffffd0);
  this_01 = kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::get(this_00);
  Impl::getSourceInfo(__return_storage_ptr__,this_01,(uint64_t)local_20);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::SourceInfo::Reader> Compiler::getSourceInfo(uint64_t id) const {
  return impl.lockExclusive()->get()->getSourceInfo(id);
}